

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_diag_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  short sVar4;
  int *piVar5;
  ulong uVar6;
  short sVar7;
  bool bVar9;
  short sVar10;
  bool bVar11;
  short sVar12;
  bool bVar13;
  short sVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  parasail_result_t *ppVar19;
  undefined2 uVar20;
  short sVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  int16_t *ptr_03;
  int16_t *ptr_04;
  int16_t *ptr_05;
  int16_t *ptr_06;
  int16_t *ptr_07;
  int16_t *ptr_08;
  long lVar25;
  short sVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  short sVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  uint uVar35;
  int iVar36;
  ulong uVar37;
  uint uVar38;
  int iVar39;
  uint uVar40;
  int iVar41;
  int16_t iVar42;
  short sVar43;
  uint uVar44;
  undefined8 unaff_R12;
  undefined4 uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  short sVar51;
  short sVar58;
  undefined1 auVar49 [16];
  short sVar59;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  short sVar75;
  ushort uVar76;
  ushort uVar77;
  short sVar82;
  short sVar84;
  short sVar87;
  short sVar90;
  short sVar92;
  short sVar94;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  ushort uVar83;
  ushort uVar85;
  ushort uVar86;
  ushort uVar88;
  ushort uVar89;
  ushort uVar91;
  ushort uVar93;
  ushort uVar95;
  short sVar96;
  ushort uVar97;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  ushort uVar98;
  ushort uVar100;
  ushort uVar101;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  undefined1 auVar99 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  short sVar107;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  short sVar114;
  undefined1 in_XMM7 [16];
  short sVar115;
  undefined1 auVar108 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined8 uVar118;
  ulong uVar120;
  undefined1 auVar119 [16];
  ulong uVar123;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 in_XMM13 [16];
  ushort uVar128;
  ushort uVar129;
  ushort uVar130;
  ushort uVar131;
  ushort uVar132;
  ushort uVar133;
  ushort uVar134;
  ushort uVar135;
  undefined8 uVar136;
  ulong uVar139;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  __m128i vEndJ;
  __m128i vMaxH;
  int16_t local_318;
  undefined1 local_2f8 [16];
  short local_2a8;
  short sStack_2a6;
  undefined2 uStack_290;
  undefined2 uStack_28e;
  undefined2 uStack_28c;
  undefined2 uStack_28a;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  ulong local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  parasail_result_t *local_160;
  int *local_158;
  ulong local_150;
  ulong local_148;
  int *local_140;
  int *local_138;
  int *local_130;
  undefined1 local_128 [16];
  undefined1 local_118 [4];
  ushort uStack_114;
  ushort uStack_112;
  ushort uStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  ulong local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined8 local_88;
  ulong uStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  short sVar8;
  short sVar45;
  short sVar50;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_stats_diag_sse41_128_16_cold_8();
  }
  else {
    uVar29 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sw_stats_diag_sse41_128_16_cold_7();
    }
    else if (open < 0) {
      parasail_sw_stats_diag_sse41_128_16_cold_6();
    }
    else if (gap < 0) {
      parasail_sw_stats_diag_sse41_128_16_cold_5();
    }
    else {
      uVar34 = (ulong)(uint)_s1Len;
      if (matrix == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_diag_sse41_128_16_cold_4();
      }
      else {
        if (matrix->type == 1) {
          if (_s1 == (char *)0x0) {
            parasail_sw_stats_diag_sse41_128_16_cold_3();
            return (parasail_result_t *)0x0;
          }
        }
        else {
          if (_s1 == (char *)0x0) {
            parasail_sw_stats_diag_sse41_128_16_cold_2();
            return (parasail_result_t *)0x0;
          }
          if (_s1Len < 1) {
            parasail_sw_stats_diag_sse41_128_16_cold_1();
            return (parasail_result_t *)0x0;
          }
        }
        if (matrix->type != 0) {
          uVar34 = (ulong)(uint)matrix->length;
        }
        iVar36 = matrix->min;
        iVar27 = -iVar36;
        if (iVar36 != -open && SBORROW4(iVar36,-open) == iVar36 + open < 0) {
          iVar27 = open;
        }
        uVar31 = iVar27 - 0x7fff;
        iVar36 = matrix->max;
        auVar47 = pshuflw(ZEXT416(uVar31),ZEXT416(uVar31),0);
        uVar46 = auVar47._0_4_;
        local_178._4_4_ = uVar46;
        local_178._0_4_ = uVar46;
        local_178._8_4_ = uVar46;
        local_178._12_4_ = uVar46;
        local_228 = CONCAT44(uVar46,uVar46);
        uStack_220 = CONCAT44(uVar46,uVar46);
        local_238 = CONCAT44(uVar46,uVar46);
        uStack_230 = CONCAT44(uVar46,uVar46);
        local_248 = CONCAT44(uVar46,uVar46);
        uStack_240 = CONCAT44(uVar46,uVar46);
        local_258 = CONCAT44(uVar46,uVar46);
        uStack_250 = CONCAT44(uVar46,uVar46);
        local_2a8 = auVar47._0_2_;
        sStack_2a6 = auVar47._2_2_;
        local_1e8._4_4_ = uVar46;
        local_1e8._0_4_ = uVar46;
        local_1e8._8_4_ = uVar46;
        local_1e8._12_4_ = uVar46;
        local_160 = parasail_result_new_stats();
        if (local_160 != (parasail_result_t *)0x0) {
          uVar44 = (uint)uVar34;
          iVar27 = uVar44 + 7;
          local_160->flag = local_160->flag | 0x8211004;
          ptr = parasail_memalign_int16_t(0x10,(long)iVar27);
          uVar28 = (ulong)(s2Len + 0xe);
          ptr_00 = parasail_memalign_int16_t(0x10,uVar28);
          ptr_01 = parasail_memalign_int16_t(0x10,uVar28);
          ptr_02 = parasail_memalign_int16_t(0x10,uVar28);
          ptr_03 = parasail_memalign_int16_t(0x10,uVar28);
          ptr_04 = parasail_memalign_int16_t(0x10,uVar28);
          ptr_05 = parasail_memalign_int16_t(0x10,uVar28);
          ptr_06 = parasail_memalign_int16_t(0x10,uVar28);
          ptr_07 = parasail_memalign_int16_t(0x10,uVar28);
          ptr_08 = parasail_memalign_int16_t(0x10,uVar28);
          if ((ptr_08 != (int16_t *)0x0 &&
              (ptr_07 != (int16_t *)0x0 && (ptr_06 != (int16_t *)0x0 && ptr_05 != (int16_t *)0x0)))
              && ((ptr_04 != (int16_t *)0x0 &&
                  (ptr_03 != (int16_t *)0x0 && ptr_02 != (int16_t *)0x0)) &&
                 ((ptr_01 != (int16_t *)0x0 && ptr_00 != (int16_t *)0x0) && ptr != (int16_t *)0x0)))
          {
            auVar47 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_R12 >> 0x10),0x7ffe - (short)iVar36
                                            ));
            auVar47 = pshuflw(auVar47,auVar47,0);
            local_1c8 = ZEXT816(0);
            auVar60 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            auVar67 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            auVar70 = pshuflw(ZEXT416(uVar44),ZEXT416(uVar44),0);
            auVar78 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
            if (0 < (int)uVar44) {
              piVar5 = matrix->mapper;
              uVar28 = 0;
              do {
                ptr[uVar28] = (int16_t)piVar5[(byte)_s1[uVar28]];
                uVar28 = uVar28 + 1;
              } while (uVar34 != uVar28);
            }
            uVar22 = s2Len + 7;
            local_1d8 = auVar47._0_2_;
            sStack_1d6 = auVar47._2_2_;
            auVar47._4_2_ = local_2a8;
            auVar47._0_4_ = uVar46;
            auVar47._6_2_ = sStack_2a6;
            auVar47._8_2_ = local_2a8;
            auVar47._10_2_ = sStack_2a6;
            auVar47._12_2_ = local_2a8;
            auVar47._14_2_ = sStack_2a6;
            local_1c8 = pblendw(local_1c8,auVar47,0x7f);
            local_d8 = auVar60._0_4_;
            local_e8 = auVar67._0_4_;
            local_108 = auVar70._0_4_;
            local_f8 = auVar78._0_4_;
            iVar36 = uVar44 + 1;
            if ((int)(uVar44 + 1) < iVar27) {
              iVar36 = iVar27;
            }
            uVar28 = 0;
            local_210 = uVar34;
            sStack_1d4 = local_1d8;
            sStack_1d2 = sStack_1d6;
            sStack_1d0 = local_1d8;
            sStack_1ce = sStack_1d6;
            sStack_1cc = local_1d8;
            sStack_1ca = sStack_1d6;
            uStack_104 = local_108;
            uStack_100 = local_108;
            uStack_fc = local_108;
            uStack_f4 = local_f8;
            uStack_f0 = local_f8;
            uStack_ec = local_f8;
            uStack_e4 = local_e8;
            uStack_e0 = local_e8;
            uStack_dc = local_e8;
            uStack_d4 = local_d8;
            uStack_d0 = local_d8;
            uStack_cc = local_d8;
            memset(ptr + (int)uVar44,0,(ulong)(~uVar44 + iVar36) * 2 + 2);
            piVar5 = matrix->mapper;
            uVar34 = 1;
            if (1 < s2Len) {
              uVar34 = uVar29;
            }
            do {
              ptr_00[uVar28 + 7] = (int16_t)piVar5[(byte)_s2[uVar28]];
              uVar28 = uVar28 + 1;
            } while (uVar34 != uVar28);
            ptr_00[3] = 0;
            ptr_00[4] = 0;
            ptr_00[5] = 0;
            ptr_00[6] = 0;
            ptr_00[0] = 0;
            ptr_00[1] = 0;
            ptr_00[2] = 0;
            ptr_00[3] = 0;
            uVar24 = s2Len + 1U;
            if ((int)(s2Len + 1U) < (int)uVar22) {
              uVar24 = uVar22;
            }
            memset(ptr_00 + uVar29 + 7,0,(ulong)(~s2Len + uVar24) * 2 + 2);
            ppVar19 = local_160;
            lVar25 = 0;
            do {
              *(undefined2 *)((long)ptr_01 + lVar25 + 0xe) = 0;
              *(undefined2 *)((long)ptr_02 + lVar25 + 0xe) = 0;
              *(undefined2 *)((long)ptr_03 + lVar25 + 0xe) = 0;
              *(undefined2 *)((long)ptr_04 + lVar25 + 0xe) = 0;
              iVar42 = (int16_t)uVar31;
              *(int16_t *)((long)ptr_05 + lVar25 + 0xe) = iVar42;
              *(undefined2 *)((long)ptr_06 + lVar25 + 0xe) = 0;
              *(undefined2 *)((long)ptr_07 + lVar25 + 0xe) = 0;
              *(undefined2 *)((long)ptr_08 + lVar25 + 0xe) = 0;
              lVar25 = lVar25 + 2;
            } while (uVar34 * 2 != lVar25);
            lVar25 = 0;
            do {
              *(int16_t *)((long)ptr_01 + lVar25) = iVar42;
              *(undefined2 *)((long)ptr_02 + lVar25) = 0;
              *(undefined2 *)((long)ptr_03 + lVar25) = 0;
              *(undefined2 *)((long)ptr_04 + lVar25) = 0;
              *(int16_t *)((long)ptr_05 + lVar25) = iVar42;
              *(undefined2 *)((long)ptr_06 + lVar25) = 0;
              *(undefined2 *)((long)ptr_07 + lVar25) = 0;
              *(undefined2 *)((long)ptr_08 + lVar25) = 0;
              lVar25 = lVar25 + 2;
            } while (lVar25 != 0xe);
            lVar25 = 0;
            do {
              ptr_01[uVar29 + lVar25 + 7] = iVar42;
              ptr_02[uVar29 + lVar25 + 7] = 0;
              ptr_03[uVar29 + lVar25 + 7] = 0;
              ptr_04[uVar29 + lVar25 + 7] = 0;
              ptr_05[uVar29 + lVar25 + 7] = iVar42;
              ptr_06[uVar29 + lVar25 + 7] = 0;
              ptr_07[uVar29 + lVar25 + 7] = 0;
              ptr_08[uVar29 + lVar25 + 7] = 0;
              lVar25 = lVar25 + 1;
            } while (s2Len + (int)lVar25 < (int)uVar22);
            ptr_01[6] = 0;
            local_1b8._8_8_ = uStack_220;
            local_1b8._0_8_ = local_228;
            local_1a8._8_8_ = uStack_230;
            local_1a8._0_8_ = local_238;
            local_198._8_8_ = uStack_240;
            local_198._0_8_ = local_248;
            local_188._8_8_ = uStack_250;
            local_188._0_8_ = local_258;
            if ((int)uVar44 < 1) {
              local_208 = CONCAT26(sStack_1d2,CONCAT24(sStack_1d4,CONCAT22(sStack_1d6,local_1d8)));
              uStack_200 = CONCAT26(sStack_1ca,CONCAT24(sStack_1cc,CONCAT22(sStack_1ce,sStack_1d0)))
              ;
              local_1f8 = CONCAT26(sStack_2a6,CONCAT24(local_2a8,uVar46));
              uStack_1f0 = CONCAT26(sStack_2a6,CONCAT24(local_2a8,uVar46));
            }
            else {
              local_158 = matrix->matrix;
              iVar36 = matrix->size;
              iVar27 = matrix->type;
              uVar44 = uVar44 - 1;
              local_148 = 1;
              if (1 < (int)uVar22) {
                local_148 = (ulong)uVar22;
              }
              auVar47 = pmovsxbw(in_XMM7,0x1020304050607);
              uVar29 = 0;
              local_1f8 = CONCAT26(sStack_2a6,CONCAT24(local_2a8,uVar46));
              uStack_1f0 = CONCAT26(sStack_2a6,CONCAT24(local_2a8,uVar46));
              local_208 = CONCAT26(sStack_1d2,CONCAT24(sStack_1d4,CONCAT22(sStack_1d6,local_1d8)));
              uStack_200 = CONCAT26(sStack_1ca,CONCAT24(sStack_1cc,CONCAT22(sStack_1ce,sStack_1d0)))
              ;
              do {
                local_a8 = auVar47;
                uVar22 = (uint)uVar29;
                uVar24 = uVar22 | 7;
                if (local_210 <= (uVar29 | 7)) {
                  uVar24 = uVar44;
                }
                if (iVar27 == 0) {
                  uVar24 = (int)ptr[uVar29 + 7];
                }
                uVar35 = uVar22 | 6;
                if (local_210 <= (uVar29 | 6)) {
                  uVar35 = uVar44;
                }
                uVar1 = ptr[uVar29 + 6];
                if (iVar27 == 0) {
                  uVar35 = (int)(short)uVar1;
                }
                uVar23 = uVar22 | 5;
                if (local_210 <= (uVar29 | 5)) {
                  uVar23 = uVar44;
                }
                uVar2 = ptr[uVar29 + 5];
                if (iVar27 == 0) {
                  uVar23 = (int)(short)uVar2;
                }
                uVar32 = uVar22 | 4;
                if (local_210 <= (uVar29 | 4)) {
                  uVar32 = uVar44;
                }
                uVar3 = ptr[uVar29 + 4];
                if (iVar27 == 0) {
                  uVar32 = (int)(short)uVar3;
                }
                uVar38 = uVar22 | 3;
                if (local_210 <= (uVar29 | 3)) {
                  uVar38 = uVar44;
                }
                sVar21 = ptr[uVar29 + 3];
                if (iVar27 == 0) {
                  uVar38 = (int)sVar21;
                }
                uVar34 = (ulong)(uint)(int)ptr[uVar29 + 7] & 0xffffffff0000ffff;
                uVar33 = uVar22 | 2;
                if (local_210 <= (uVar29 | 2)) {
                  uVar33 = uVar44;
                }
                sVar26 = ptr[uVar29 + 2];
                if (iVar27 == 0) {
                  uVar33 = (int)sVar26;
                }
                uVar40 = uVar22 | 1;
                if (local_210 <= (uVar29 | 1)) {
                  uVar40 = uVar44;
                }
                sVar30 = ptr[uVar29];
                sVar43 = ptr[uVar29 + 1];
                local_b8 = uVar34 | (ulong)uVar1 << 0x10 | (ulong)uVar2 << 0x20 |
                           (ulong)uVar3 << 0x30;
                uVar28 = local_b8;
                uStack_b0 = CONCAT26(sVar30,CONCAT24(sVar43,CONCAT22(sVar26,sVar21)));
                local_150 = uVar29;
                if (iVar27 == 0) {
                  uVar40 = (int)sVar43;
                  uVar22 = (int)sVar30;
                }
                local_130 = local_158 + (int)(uVar22 * iVar36);
                local_138 = local_158 + (int)(uVar40 * iVar36);
                local_140 = local_158 + (int)(uVar33 * iVar36);
                local_c8 = -(ushort)(auVar47._0_2_ < (short)local_108);
                sStack_c6 = -(ushort)(auVar47._2_2_ < local_108._2_2_);
                sStack_c4 = -(ushort)(auVar47._4_2_ < (short)uStack_104);
                sStack_c2 = -(ushort)(auVar47._6_2_ < uStack_104._2_2_);
                sStack_c0 = -(ushort)(auVar47._8_2_ < (short)uStack_100);
                sStack_be = -(ushort)(auVar47._10_2_ < uStack_100._2_2_);
                sStack_bc = -(ushort)(auVar47._12_2_ < (short)uStack_fc);
                sStack_ba = -(ushort)(auVar47._14_2_ < uStack_fc._2_2_);
                uVar37 = 0;
                auVar60._4_2_ = local_2a8;
                auVar60._0_4_ = uVar46;
                auVar60._6_2_ = sStack_2a6;
                auVar60._8_2_ = local_2a8;
                auVar60._10_2_ = sStack_2a6;
                auVar60._12_2_ = local_2a8;
                auVar60._14_2_ = sStack_2a6;
                in_XMM13 = pmovsxbw(in_XMM13,0xfffefdfcfbfaf9);
                auVar125 = (undefined1  [16])0x0;
                auVar71 = (undefined1  [16])0x0;
                auVar116 = (undefined1  [16])0x0;
                auVar78 = (undefined1  [16])0x0;
                auVar73 = ZEXT816(0);
                auVar105 = (undefined1  [16])0x0;
                local_278 = (undefined1  [16])0x0;
                auVar79 = (undefined1  [16])0x0;
                local_2f8 = (undefined1  [16])0x0;
                local_78._0_8_ = 0;
                uVar123 = 0;
                uVar120 = 0;
                auVar67 = local_1c8;
                auVar70 = local_1c8;
                uVar136 = 0;
                uVar139 = 0;
                uVar118 = 0;
                local_128 = auVar60;
                _local_118 = auVar60;
                do {
                  local_98 = auVar79;
                  uStack_290 = (undefined2)uVar120;
                  uStack_28e = (undefined2)(uVar120 >> 0x10);
                  uStack_28c = (undefined2)(uVar120 >> 0x20);
                  uStack_28a = (undefined2)(uVar120 >> 0x30);
                  local_288._8_8_ = uVar123;
                  local_288._0_8_ = local_78._0_8_;
                  local_58._0_8_ = auVar70._2_8_;
                  local_58._8_8_ = auVar70._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar37 + 7] << 0x30
                  ;
                  local_68._0_8_ = local_2f8._2_8_;
                  uVar120 = local_2f8._8_8_ >> 0x10 | (ulong)(ushort)ptr_02[uVar37 + 7] << 0x30;
                  local_68._8_8_ = uVar120;
                  local_78._0_8_ = auVar79._2_8_;
                  uVar123 = auVar79._8_8_ >> 0x10 | (ulong)(ushort)ptr_03[uVar37 + 7] << 0x30;
                  local_78._8_8_ = uVar123;
                  auVar99._0_8_ = auVar60._2_8_;
                  auVar99._8_8_ = auVar60._8_8_ >> 0x10 | (ulong)(ushort)ptr_05[uVar37 + 7] << 0x30;
                  auVar68._0_8_ = auVar116._2_8_;
                  auVar68._8_8_ = auVar116._8_8_ >> 0x10 | (ulong)(ushort)ptr_06[uVar37 + 7] << 0x30
                  ;
                  auVar72._0_8_ = auVar71._2_8_;
                  auVar72._8_8_ = auVar71._8_8_ >> 0x10 | (ulong)(ushort)ptr_07[uVar37 + 7] << 0x30;
                  auVar138._4_4_ = uStack_d4;
                  auVar138._0_4_ = local_d8;
                  auVar138._8_4_ = uStack_d0;
                  auVar138._12_4_ = uStack_cc;
                  auVar60 = psubsw(local_58,auVar138);
                  auVar124._4_4_ = uStack_e4;
                  auVar124._0_4_ = local_e8;
                  auVar124._8_4_ = uStack_e0;
                  auVar124._12_4_ = uStack_dc;
                  auVar116 = psubsw(auVar99,auVar124);
                  sVar45 = auVar60._0_2_;
                  sVar75 = auVar116._0_2_;
                  auVar48._0_2_ = -(ushort)(sVar75 < sVar45);
                  sVar50 = auVar60._2_2_;
                  sVar82 = auVar116._2_2_;
                  auVar48._2_2_ = -(ushort)(sVar82 < sVar50);
                  sVar52 = auVar60._4_2_;
                  sVar84 = auVar116._4_2_;
                  auVar48._4_2_ = -(ushort)(sVar84 < sVar52);
                  sVar53 = auVar60._6_2_;
                  sVar87 = auVar116._6_2_;
                  auVar48._6_2_ = -(ushort)(sVar87 < sVar53);
                  sVar54 = auVar60._8_2_;
                  sVar90 = auVar116._8_2_;
                  auVar48._8_2_ = -(ushort)(sVar90 < sVar54);
                  sVar55 = auVar60._10_2_;
                  sVar92 = auVar116._10_2_;
                  auVar48._10_2_ = -(ushort)(sVar92 < sVar55);
                  sVar56 = auVar60._12_2_;
                  sVar94 = auVar116._12_2_;
                  sVar57 = auVar60._14_2_;
                  auVar48._12_2_ = -(ushort)(sVar94 < sVar56);
                  sVar96 = auVar116._14_2_;
                  auVar48._14_2_ = -(ushort)(sVar96 < sVar57);
                  auVar116 = pblendvb(auVar68,local_68,auVar48);
                  local_88 = uVar136;
                  uStack_80 = uVar139;
                  auVar71 = pblendvb(auVar72,local_78,auVar48);
                  local_48._0_8_ = local_278._2_8_;
                  uVar6 = local_278._8_8_ >> 0x10 | (ulong)(ushort)ptr_04[uVar37 + 7] << 0x30;
                  local_48._8_8_ = uVar6;
                  auVar126._0_8_ = auVar125._2_8_;
                  auVar126._8_8_ =
                       auVar125._8_8_ >> 0x10 | (ulong)(ushort)ptr_08[uVar37 + 7] << 0x30;
                  auVar127 = pblendvb(auVar126,local_48,auVar48);
                  auVar60 = psubsw(auVar70,auVar138);
                  auVar70 = psubsw(local_128,auVar124);
                  sVar59 = auVar60._0_2_;
                  sVar107 = auVar70._0_2_;
                  auVar125._0_2_ = -(ushort)(sVar107 < sVar59);
                  sVar62 = auVar60._2_2_;
                  sVar109 = auVar70._2_2_;
                  auVar125._2_2_ = -(ushort)(sVar109 < sVar62);
                  sVar63 = auVar60._4_2_;
                  sVar110 = auVar70._4_2_;
                  auVar125._4_2_ = -(ushort)(sVar110 < sVar63);
                  sVar64 = auVar60._6_2_;
                  sVar111 = auVar70._6_2_;
                  auVar125._6_2_ = -(ushort)(sVar111 < sVar64);
                  sVar65 = auVar60._8_2_;
                  sVar112 = auVar70._8_2_;
                  auVar125._8_2_ = -(ushort)(sVar112 < sVar65);
                  sVar66 = auVar60._10_2_;
                  sVar113 = auVar70._10_2_;
                  auVar125._10_2_ = -(ushort)(sVar113 < sVar66);
                  sVar51 = auVar60._12_2_;
                  sVar114 = auVar70._12_2_;
                  sVar58 = auVar60._14_2_;
                  auVar125._12_2_ = -(ushort)(sVar114 < sVar51);
                  sVar115 = auVar70._14_2_;
                  auVar125._14_2_ = -(ushort)(sVar115 < sVar58);
                  auVar105 = pblendvb(auVar105,local_2f8,auVar125);
                  sVar7 = (short)(local_158 + (int)(uVar33 * iVar36))[ptr_00[uVar37 + 5]];
                  sVar8 = (short)(local_158 + (int)(uVar40 * iVar36))[ptr_00[uVar37 + 6]];
                  auVar121._10_2_ = sVar7;
                  auVar121._8_2_ =
                       (short)local_158[(long)(int)(uVar38 * iVar36) + (long)ptr_00[uVar37 + 4]];
                  auVar121._12_2_ = sVar8;
                  uVar20 = local_118._2_2_;
                  uVar76 = uStack_114;
                  uVar77 = uStack_112;
                  uVar83 = uStack_110;
                  sVar10 = sStack_10e;
                  sVar12 = sStack_10c;
                  sVar14 = sStack_10a;
                  sVar4 = ptr_00[uVar37 + 7];
                  local_b8._0_2_ = (short)uVar34;
                  _local_118 = stack0xfffffffffffffeea;
                  sStack_10a = sVar4;
                  auVar137._0_2_ = (ushort)-(ushort)((short)local_b8 == uVar20) >> 0xf;
                  auVar137._2_2_ = (ushort)-(ushort)(uVar1 == uVar76) >> 0xf;
                  auVar137._4_2_ = (ushort)-(ushort)(uVar2 == uVar77) >> 0xf;
                  auVar137._6_2_ = (ushort)-(ushort)(uVar3 == uVar83) >> 0xf;
                  auVar137._8_2_ = (ushort)-(ushort)(sVar21 == sVar10) >> 0xf;
                  auVar137._10_2_ = (ushort)-(ushort)(sVar26 == sVar12) >> 0xf;
                  auVar137._12_2_ = (ushort)-(ushort)(sVar43 == sVar14) >> 0xf;
                  auVar137._14_2_ = (ushort)-(ushort)(sVar30 == sVar4) >> 0xf;
                  auVar70._8_2_ = uStack_290;
                  auVar70._0_8_ = uVar118;
                  auVar70._10_2_ = uStack_28e;
                  auVar70._12_2_ = uStack_28c;
                  auVar70._14_2_ = uStack_28a;
                  auVar138 = paddsw(auVar137,auVar70);
                  sVar4 = (short)(local_158 + (int)(uVar22 * iVar36))[sVar4];
                  auVar121._14_2_ = sVar4;
                  auVar121._0_8_ =
                       (ulong)(uint)local_158[(long)(int)(uVar24 * iVar36) + (long)ptr_00[uVar37]] &
                       0xffffffff0000ffff |
                       (ulong)*(ushort *)
                               (local_158 + (long)(int)(uVar35 * iVar36) + (long)ptr_00[uVar37 + 1])
                       << 0x10 | (ulong)*(ushort *)
                                         (local_158 +
                                         (long)(int)(uVar23 * iVar36) + (long)ptr_00[uVar37 + 2]) <<
                                 0x20 |
                       (ulong)*(ushort *)
                               (local_158 + (long)(int)(uVar32 * iVar36) + (long)ptr_00[uVar37 + 3])
                       << 0x30;
                  auVar60 = paddsw(auVar67,auVar121);
                  auVar122._0_2_ =
                       (ushort)-(ushort)(0 < (short)((ulong)(uint)local_158[(long)(int)(uVar24 * 
                                                  iVar36) + (long)ptr_00[uVar37]] &
                                                  0xffffffff0000ffff)) >> 0xf;
                  auVar122._2_2_ =
                       (ushort)-(ushort)(0 < (short)*(ushort *)
                                                     (local_158 +
                                                     (long)(int)(uVar35 * iVar36) +
                                                     (long)ptr_00[uVar37 + 1])) >> 0xf;
                  auVar122._4_2_ =
                       (ushort)-(ushort)(0 < (short)*(ushort *)
                                                     (local_158 +
                                                     (long)(int)(uVar23 * iVar36) +
                                                     (long)ptr_00[uVar37 + 2])) >> 0xf;
                  auVar122._6_2_ =
                       (ushort)-(ushort)(0 < (short)*(ushort *)
                                                     (local_158 +
                                                     (long)(int)(uVar32 * iVar36) +
                                                     (long)ptr_00[uVar37 + 3])) >> 0xf;
                  auVar122._8_2_ =
                       (ushort)-(ushort)(0 < (short)local_158[(long)(int)(uVar38 * iVar36) +
                                                              (long)ptr_00[uVar37 + 4]]) >> 0xf;
                  auVar122._10_2_ = (ushort)-(ushort)(0 < sVar7) >> 0xf;
                  auVar122._12_2_ = (ushort)-(ushort)(0 < sVar8) >> 0xf;
                  auVar122._14_2_ = (ushort)-(ushort)(0 < sVar4) >> 0xf;
                  auVar70 = paddsw(auVar122,local_288);
                  uVar128 = (ushort)(sVar45 < sVar75) * sVar75 | (ushort)(sVar45 >= sVar75) * sVar45
                  ;
                  uVar129 = (ushort)(sVar50 < sVar82) * sVar82 | (ushort)(sVar50 >= sVar82) * sVar50
                  ;
                  uVar130 = (ushort)(sVar52 < sVar84) * sVar84 | (ushort)(sVar52 >= sVar84) * sVar52
                  ;
                  uVar131 = (ushort)(sVar53 < sVar87) * sVar87 | (ushort)(sVar53 >= sVar87) * sVar53
                  ;
                  uVar132 = (ushort)(sVar54 < sVar90) * sVar90 | (ushort)(sVar54 >= sVar90) * sVar54
                  ;
                  uVar133 = (ushort)(sVar55 < sVar92) * sVar92 | (ushort)(sVar55 >= sVar92) * sVar55
                  ;
                  uVar134 = (ushort)(sVar56 < sVar94) * sVar94 | (ushort)(sVar56 >= sVar94) * sVar56
                  ;
                  uVar135 = (ushort)(sVar57 < sVar96) * sVar96 | (ushort)(sVar57 >= sVar96) * sVar57
                  ;
                  auVar119._0_2_ =
                       (ushort)(sVar59 < sVar107) * sVar107 | (ushort)(sVar59 >= sVar107) * sVar59;
                  auVar119._2_2_ =
                       (ushort)(sVar62 < sVar109) * sVar109 | (ushort)(sVar62 >= sVar109) * sVar62;
                  auVar119._4_2_ =
                       (ushort)(sVar63 < sVar110) * sVar110 | (ushort)(sVar63 >= sVar110) * sVar63;
                  auVar119._6_2_ =
                       (ushort)(sVar64 < sVar111) * sVar111 | (ushort)(sVar64 >= sVar111) * sVar64;
                  auVar119._8_2_ =
                       (ushort)(sVar65 < sVar112) * sVar112 | (ushort)(sVar65 >= sVar112) * sVar65;
                  auVar119._10_2_ =
                       (ushort)(sVar66 < sVar113) * sVar113 | (ushort)(sVar66 >= sVar113) * sVar66;
                  auVar119._12_2_ =
                       (ushort)(sVar51 < sVar114) * sVar114 | (ushort)(sVar51 >= sVar114) * sVar51;
                  auVar119._14_2_ =
                       (ushort)(sVar58 < sVar115) * sVar115 | (ushort)(sVar58 >= sVar115) * sVar58;
                  auVar73 = pblendvb(auVar73,auVar79,auVar125);
                  auVar67 = pblendvb(auVar78,local_278,auVar125);
                  uVar76 = ((short)auVar119._0_2_ < (short)uVar128) * uVar128 |
                           ((short)auVar119._0_2_ >= (short)uVar128) * auVar119._0_2_;
                  uVar83 = ((short)auVar119._2_2_ < (short)uVar129) * uVar129 |
                           ((short)auVar119._2_2_ >= (short)uVar129) * auVar119._2_2_;
                  uVar85 = ((short)auVar119._4_2_ < (short)uVar130) * uVar130 |
                           ((short)auVar119._4_2_ >= (short)uVar130) * auVar119._4_2_;
                  uVar88 = ((short)auVar119._6_2_ < (short)uVar131) * uVar131 |
                           ((short)auVar119._6_2_ >= (short)uVar131) * auVar119._6_2_;
                  uVar91 = ((short)auVar119._8_2_ < (short)uVar132) * uVar132 |
                           ((short)auVar119._8_2_ >= (short)uVar132) * auVar119._8_2_;
                  uVar93 = ((short)auVar119._10_2_ < (short)uVar133) * uVar133 |
                           ((short)auVar119._10_2_ >= (short)uVar133) * auVar119._10_2_;
                  uVar95 = ((short)auVar119._12_2_ < (short)uVar134) * uVar134 |
                           ((short)auVar119._12_2_ >= (short)uVar134) * auVar119._12_2_;
                  uVar97 = ((short)auVar119._14_2_ < (short)uVar135) * uVar135 |
                           ((short)auVar119._14_2_ >= (short)uVar135) * auVar119._14_2_;
                  uVar98 = auVar60._0_2_;
                  uVar77 = ((short)uVar76 < (short)uVar98) * uVar98 |
                           ((short)uVar76 >= (short)uVar98) * uVar76;
                  uVar100 = auVar60._2_2_;
                  uVar76 = ((short)uVar83 < (short)uVar100) * uVar100 |
                           ((short)uVar83 >= (short)uVar100) * uVar83;
                  uVar101 = auVar60._4_2_;
                  uVar86 = ((short)uVar85 < (short)uVar101) * uVar101 |
                           ((short)uVar85 >= (short)uVar101) * uVar85;
                  uVar102 = auVar60._6_2_;
                  uVar89 = ((short)uVar88 < (short)uVar102) * uVar102 |
                           ((short)uVar88 >= (short)uVar102) * uVar88;
                  uVar103 = auVar60._8_2_;
                  uVar83 = ((short)uVar91 < (short)uVar103) * uVar103 |
                           ((short)uVar91 >= (short)uVar103) * uVar91;
                  uVar104 = auVar60._10_2_;
                  uVar85 = ((short)uVar93 < (short)uVar104) * uVar104 |
                           ((short)uVar93 >= (short)uVar104) * uVar93;
                  uVar93 = auVar60._12_2_;
                  uVar88 = ((short)uVar95 < (short)uVar93) * uVar93 |
                           ((short)uVar95 >= (short)uVar93) * uVar95;
                  uVar95 = auVar60._14_2_;
                  uVar91 = ((short)uVar97 < (short)uVar95) * uVar95 |
                           ((short)uVar97 >= (short)uVar95) * uVar97;
                  auVar124 = pmovsxbw(auVar105,0x101010101010101);
                  auVar108._0_2_ = -(ushort)((short)uVar77 < auVar124._0_2_);
                  auVar108._2_2_ = -(ushort)((short)uVar76 < auVar124._2_2_);
                  auVar108._4_2_ = -(ushort)((short)uVar86 < auVar124._4_2_);
                  auVar108._6_2_ = -(ushort)((short)uVar89 < auVar124._6_2_);
                  auVar108._8_2_ = -(ushort)((short)uVar83 < auVar124._8_2_);
                  auVar108._10_2_ = -(ushort)((short)uVar85 < auVar124._10_2_);
                  auVar108._12_2_ = -(ushort)((short)uVar88 < auVar124._12_2_);
                  auVar108._14_2_ = -(ushort)((short)uVar91 < auVar124._14_2_);
                  uVar77 = (-1 < (short)uVar77) * uVar77;
                  uVar76 = (-1 < (short)uVar76) * uVar76;
                  auVar80._2_2_ = uVar76;
                  auVar80._0_2_ = uVar77;
                  uVar86 = (-1 < (short)uVar86) * uVar86;
                  auVar80._4_2_ = uVar86;
                  uVar89 = (-1 < (short)uVar89) * uVar89;
                  auVar80._6_2_ = uVar89;
                  uVar83 = (-1 < (short)uVar83) * uVar83;
                  auVar80._8_2_ = uVar83;
                  uVar85 = (-1 < (short)uVar85) * uVar85;
                  auVar80._10_2_ = uVar85;
                  uVar88 = (-1 < (short)uVar88) * uVar88;
                  auVar80._12_2_ = uVar88;
                  uVar91 = (-1 < (short)uVar91) * uVar91;
                  auVar80._14_2_ = uVar91;
                  auVar106._0_2_ = -(ushort)(uVar98 == uVar77);
                  auVar106._2_2_ = -(ushort)(uVar100 == uVar76);
                  auVar106._4_2_ = -(ushort)(uVar101 == uVar86);
                  auVar106._6_2_ = -(ushort)(uVar102 == uVar89);
                  auVar106._8_2_ = -(ushort)(uVar103 == uVar83);
                  auVar106._10_2_ = -(ushort)(uVar104 == uVar85);
                  auVar106._12_2_ = -(ushort)(uVar93 == uVar88);
                  auVar106._14_2_ = -(ushort)(uVar95 == uVar91);
                  auVar61._0_2_ = -(ushort)(uVar77 == uVar128);
                  auVar61._2_2_ = -(ushort)(uVar76 == uVar129);
                  auVar61._4_2_ = -(ushort)(uVar86 == uVar130);
                  auVar61._6_2_ = -(ushort)(uVar89 == uVar131);
                  auVar61._8_2_ = -(ushort)(uVar83 == uVar132);
                  auVar61._10_2_ = -(ushort)(uVar85 == uVar133);
                  auVar61._12_2_ = -(ushort)(uVar88 == uVar134);
                  auVar61._14_2_ = -(ushort)(uVar91 == uVar135);
                  auVar60 = pblendvb(auVar105,auVar116,auVar61);
                  local_2f8 = pblendvb(auVar60,auVar138,auVar106);
                  auVar60 = pblendvb(auVar73,auVar71,auVar61);
                  auVar79 = pblendvb(auVar60,auVar70,auVar106);
                  auVar125 = paddsw(auVar127,auVar124);
                  auVar78 = paddsw(auVar67,auVar124);
                  auVar67 = pblendvb(auVar78,auVar125,auVar61);
                  auVar127._8_8_ = uVar139;
                  auVar127._0_8_ = uVar136;
                  auVar60 = paddsw(auVar127,auVar124);
                  local_278 = pblendvb(auVar67,auVar60,auVar106);
                  sVar55 = in_XMM13._0_2_;
                  auVar69._0_2_ = -(ushort)(sVar55 == -1);
                  sVar56 = in_XMM13._2_2_;
                  auVar69._2_2_ = -(ushort)(sVar56 == -1);
                  sVar57 = in_XMM13._4_2_;
                  auVar69._4_2_ = -(ushort)(sVar57 == -1);
                  sVar59 = in_XMM13._6_2_;
                  auVar69._6_2_ = -(ushort)(sVar59 == -1);
                  sVar62 = in_XMM13._8_2_;
                  auVar69._8_2_ = -(ushort)(sVar62 == -1);
                  sVar63 = in_XMM13._10_2_;
                  auVar69._10_2_ = -(ushort)(sVar63 == -1);
                  sVar64 = in_XMM13._12_2_;
                  sVar65 = in_XMM13._14_2_;
                  auVar69._12_2_ = -(ushort)(sVar64 == -1);
                  auVar69._14_2_ = -(ushort)(sVar65 == -1);
                  auVar108 = auVar108 | auVar69;
                  local_2f8 = ~auVar108 & local_2f8;
                  auVar79 = ~auVar108 & auVar79;
                  auVar67._4_2_ = local_2a8;
                  auVar67._0_4_ = uVar46;
                  auVar67._6_2_ = sStack_2a6;
                  auVar67._8_2_ = local_2a8;
                  auVar67._10_2_ = sStack_2a6;
                  auVar67._12_2_ = local_2a8;
                  auVar67._14_2_ = sStack_2a6;
                  local_128 = pblendvb(auVar119,auVar67,auVar69);
                  local_278 = ~auVar108 & local_278;
                  auVar70 = ~auVar69 & auVar80;
                  sVar4 = auVar70._0_2_;
                  sVar10 = auVar70._2_2_;
                  sVar53 = auVar70._14_2_;
                  sVar12 = auVar70._4_2_;
                  sVar14 = auVar70._6_2_;
                  sVar45 = auVar70._8_2_;
                  sVar50 = auVar70._10_2_;
                  sVar52 = auVar70._12_2_;
                  sVar7 = local_2f8._0_2_;
                  sVar8 = local_278._0_2_;
                  sVar54 = auVar79._0_2_;
                  if (7 < uVar37) {
                    bVar9 = sVar4 < (short)local_208;
                    uVar91 = (ushort)!bVar9 * (short)local_208;
                    bVar11 = sVar10 < local_208._2_2_;
                    uVar88 = (ushort)!bVar11 * local_208._2_2_;
                    bVar13 = sVar12 < local_208._4_2_;
                    uVar85 = (ushort)!bVar13 * local_208._4_2_;
                    bVar15 = sVar45 < (short)uStack_200;
                    uVar77 = (ushort)!bVar15 * (short)uStack_200;
                    bVar16 = sVar50 < uStack_200._2_2_;
                    uVar76 = (ushort)!bVar16 * uStack_200._2_2_;
                    bVar17 = sVar52 < uStack_200._4_2_;
                    uVar83 = (ushort)!bVar17 * uStack_200._4_2_;
                    local_208 = CONCAT26((ushort)(sVar14 < local_208._6_2_) * sVar14 |
                                         (ushort)(sVar14 >= local_208._6_2_) * local_208._6_2_,
                                         CONCAT24((ushort)bVar13 * sVar12 | uVar85,
                                                  CONCAT22((ushort)bVar11 * sVar10 | uVar88,
                                                           (ushort)bVar9 * sVar4 | uVar91)));
                    uStack_200 = CONCAT26((ushort)(sVar53 < uStack_200._6_2_) * sVar53 |
                                          (ushort)(sVar53 >= uStack_200._6_2_) * uStack_200._6_2_,
                                          CONCAT24((ushort)bVar17 * sVar52 | uVar83,
                                                   CONCAT22((ushort)bVar16 * sVar50 | uVar76,
                                                            (ushort)bVar15 * sVar45 | uVar77)));
                    uVar76 = (ushort)((short)local_1f8 < sVar4) * sVar4 |
                             (ushort)((short)local_1f8 >= sVar4) * (short)local_1f8;
                    uVar77 = (ushort)(local_1f8._2_2_ < sVar10) * sVar10 |
                             (ushort)(local_1f8._2_2_ >= sVar10) * local_1f8._2_2_;
                    uVar83 = (ushort)(local_1f8._4_2_ < sVar12) * sVar12 |
                             (ushort)(local_1f8._4_2_ >= sVar12) * local_1f8._4_2_;
                    uVar85 = (ushort)(local_1f8._6_2_ < sVar14) * sVar14 |
                             (ushort)(local_1f8._6_2_ >= sVar14) * local_1f8._6_2_;
                    uVar88 = (ushort)((short)uStack_1f0 < sVar45) * sVar45 |
                             (ushort)((short)uStack_1f0 >= sVar45) * (short)uStack_1f0;
                    uVar91 = (ushort)(uStack_1f0._2_2_ < sVar50) * sVar50 |
                             (ushort)(uStack_1f0._2_2_ >= sVar50) * uStack_1f0._2_2_;
                    uVar89 = (ushort)(uStack_1f0._4_2_ < sVar52) * sVar52 |
                             (ushort)(uStack_1f0._4_2_ >= sVar52) * uStack_1f0._4_2_;
                    uVar86 = (ushort)(uStack_1f0._6_2_ < sVar53) * sVar53 |
                             (ushort)(uStack_1f0._6_2_ >= sVar53) * uStack_1f0._6_2_;
                    uVar98 = (ushort)((short)uVar76 < sVar7) * sVar7 |
                             ((short)uVar76 >= sVar7) * uVar76;
                    sVar66 = local_2f8._2_2_;
                    uVar100 = (ushort)((short)uVar77 < sVar66) * sVar66 |
                              ((short)uVar77 >= sVar66) * uVar77;
                    sVar66 = local_2f8._4_2_;
                    uVar101 = (ushort)((short)uVar83 < sVar66) * sVar66 |
                              ((short)uVar83 >= sVar66) * uVar83;
                    sVar66 = local_2f8._6_2_;
                    uVar102 = (ushort)((short)uVar85 < sVar66) * sVar66 |
                              ((short)uVar85 >= sVar66) * uVar85;
                    sVar66 = local_2f8._8_2_;
                    uVar103 = (ushort)((short)uVar88 < sVar66) * sVar66 |
                              ((short)uVar88 >= sVar66) * uVar88;
                    sVar66 = local_2f8._10_2_;
                    uVar104 = (ushort)((short)uVar91 < sVar66) * sVar66 |
                              ((short)uVar91 >= sVar66) * uVar91;
                    sVar66 = local_2f8._12_2_;
                    uVar93 = (ushort)((short)uVar89 < sVar66) * sVar66 |
                             ((short)uVar89 >= sVar66) * uVar89;
                    sVar66 = local_2f8._14_2_;
                    uVar95 = (ushort)((short)uVar86 < sVar66) * sVar66 |
                             ((short)uVar86 >= sVar66) * uVar86;
                    uVar76 = (ushort)(sVar54 < sVar8) * sVar8 | (ushort)(sVar54 >= sVar8) * sVar54;
                    sVar66 = local_278._2_2_;
                    sVar51 = auVar79._2_2_;
                    uVar77 = (ushort)(sVar51 < sVar66) * sVar66 |
                             (ushort)(sVar51 >= sVar66) * sVar51;
                    sVar66 = local_278._4_2_;
                    sVar51 = auVar79._4_2_;
                    uVar83 = (ushort)(sVar51 < sVar66) * sVar66 |
                             (ushort)(sVar51 >= sVar66) * sVar51;
                    sVar66 = local_278._6_2_;
                    sVar51 = auVar79._6_2_;
                    uVar85 = (ushort)(sVar51 < sVar66) * sVar66 |
                             (ushort)(sVar51 >= sVar66) * sVar51;
                    sVar66 = local_278._8_2_;
                    sVar51 = auVar79._8_2_;
                    uVar88 = (ushort)(sVar51 < sVar66) * sVar66 |
                             (ushort)(sVar51 >= sVar66) * sVar51;
                    sVar66 = local_278._10_2_;
                    sVar51 = auVar79._10_2_;
                    uVar91 = (ushort)(sVar51 < sVar66) * sVar66 |
                             (ushort)(sVar51 >= sVar66) * sVar51;
                    sVar66 = local_278._12_2_;
                    sVar51 = auVar79._12_2_;
                    sVar58 = auVar79._14_2_;
                    uVar89 = (ushort)(sVar51 < sVar66) * sVar66 |
                             (ushort)(sVar51 >= sVar66) * sVar51;
                    sVar66 = local_278._14_2_;
                    uVar86 = (ushort)(sVar58 < sVar66) * sVar66 |
                             (ushort)(sVar58 >= sVar66) * sVar58;
                    local_1f8 = CONCAT26(((short)uVar102 < (short)uVar85) * uVar85 |
                                         ((short)uVar102 >= (short)uVar85) * uVar102,
                                         CONCAT24(((short)uVar101 < (short)uVar83) * uVar83 |
                                                  ((short)uVar101 >= (short)uVar83) * uVar101,
                                                  CONCAT22(((short)uVar100 < (short)uVar77) * uVar77
                                                           | ((short)uVar100 >= (short)uVar77) *
                                                             uVar100,
                                                           ((short)uVar98 < (short)uVar76) * uVar76
                                                           | ((short)uVar98 >= (short)uVar76) *
                                                             uVar98)));
                    uStack_1f0 = CONCAT26(((short)uVar95 < (short)uVar86) * uVar86 |
                                          ((short)uVar95 >= (short)uVar86) * uVar95,
                                          CONCAT24(((short)uVar93 < (short)uVar89) * uVar89 |
                                                   ((short)uVar93 >= (short)uVar89) * uVar93,
                                                   CONCAT22(((short)uVar104 < (short)uVar91) *
                                                            uVar91 | ((short)uVar104 >=
                                                                     (short)uVar91) * uVar104,
                                                            ((short)uVar103 < (short)uVar88) *
                                                            uVar88 | ((short)uVar103 >=
                                                                     (short)uVar88) * uVar103)));
                  }
                  ptr_01[uVar37] = sVar4;
                  ptr_02[uVar37] = sVar7;
                  ptr_03[uVar37] = sVar54;
                  ptr_04[uVar37] = sVar8;
                  ptr_05[uVar37] = uVar128;
                  local_288._0_2_ = auVar116._0_2_;
                  ptr_06[uVar37] = local_288._0_2_;
                  auVar105 = ~auVar69 & auVar105;
                  local_318 = auVar71._0_2_;
                  ptr_07[uVar37] = local_318;
                  ptr_08[uVar37] = auVar125._0_2_;
                  auVar49._0_2_ = -(ushort)(sVar55 < (short)local_f8);
                  auVar49._2_2_ = -(ushort)(sVar56 < local_f8._2_2_);
                  auVar49._4_2_ = -(ushort)(sVar57 < (short)uStack_f4);
                  auVar49._6_2_ = -(ushort)(sVar59 < uStack_f4._2_2_);
                  auVar49._8_2_ = -(ushort)(sVar62 < (short)uStack_f0);
                  auVar49._10_2_ = -(ushort)(sVar63 < uStack_f0._2_2_);
                  auVar49._12_2_ = -(ushort)(sVar64 < (short)uStack_ec);
                  auVar49._14_2_ = -(ushort)(sVar65 < uStack_ec._2_2_);
                  auVar18._2_2_ = sStack_c6;
                  auVar18._0_2_ = local_c8;
                  auVar18._4_2_ = sStack_c4;
                  auVar18._6_2_ = sStack_c2;
                  auVar18._8_2_ = sStack_c0;
                  auVar18._10_2_ = sStack_be;
                  auVar18._12_2_ = sStack_bc;
                  auVar18._14_2_ = sStack_ba;
                  auVar60 = psraw(in_XMM13,0xf);
                  auVar67 = ~auVar60 & auVar49 & auVar18;
                  auVar117._0_2_ = -(ushort)(sVar4 == local_178._0_2_);
                  auVar117._2_2_ = -(ushort)(sVar10 == local_178._2_2_);
                  auVar117._4_2_ = -(ushort)(sVar12 == local_178._4_2_);
                  auVar117._6_2_ = -(ushort)(sVar14 == local_178._6_2_);
                  auVar117._8_2_ = -(ushort)(sVar45 == local_178._8_2_);
                  auVar117._10_2_ = -(ushort)(sVar50 == local_178._10_2_);
                  auVar117._12_2_ = -(ushort)(sVar52 == local_178._12_2_);
                  auVar117._14_2_ = -(ushort)(sVar53 == local_178._14_2_);
                  auVar74._0_2_ = -(ushort)(local_178._0_2_ < sVar4);
                  auVar74._2_2_ = -(ushort)(local_178._2_2_ < sVar10);
                  auVar74._4_2_ = -(ushort)(local_178._4_2_ < sVar12);
                  auVar74._6_2_ = -(ushort)(local_178._6_2_ < sVar14);
                  auVar74._8_2_ = -(ushort)(local_178._8_2_ < sVar45);
                  auVar74._10_2_ = -(ushort)(local_178._10_2_ < sVar50);
                  auVar74._12_2_ = -(ushort)(local_178._12_2_ < sVar52);
                  auVar74._14_2_ = -(ushort)(local_178._14_2_ < sVar53);
                  auVar74 = auVar74 & auVar67;
                  local_178 = pblendvb(local_178,auVar80,auVar74);
                  auVar124 = pblendvb(local_1e8,in_XMM13,auVar74);
                  auVar81._0_2_ = -(ushort)(sVar55 < local_1e8._0_2_);
                  auVar81._2_2_ = -(ushort)(sVar56 < local_1e8._2_2_);
                  auVar81._4_2_ = -(ushort)(sVar57 < local_1e8._4_2_);
                  auVar81._6_2_ = -(ushort)(sVar59 < local_1e8._6_2_);
                  auVar81._8_2_ = -(ushort)(sVar62 < local_1e8._8_2_);
                  auVar81._10_2_ = -(ushort)(sVar63 < local_1e8._10_2_);
                  auVar81._12_2_ = -(ushort)(sVar64 < local_1e8._12_2_);
                  auVar81._14_2_ = -(ushort)(sVar65 < local_1e8._14_2_);
                  auVar60 = pblendvb(auVar74,auVar67,auVar81 & auVar117);
                  local_1b8 = pblendvb(local_1b8,local_2f8,auVar60);
                  auVar73 = ~auVar69 & auVar73;
                  local_1a8 = pblendvb(local_1a8,auVar79,auVar60);
                  auVar78 = ~auVar69 & auVar78;
                  local_198 = pblendvb(local_198,local_278,auVar60);
                  local_188 = pblendvb(local_188,auVar47,auVar60);
                  auVar67 = auVar81 & auVar117 & auVar67;
                  local_1e8 = pblendvb(auVar124,in_XMM13,auVar67);
                  auVar60 = pmovsxbw(auVar67,0x101010101010101);
                  in_XMM13 = paddsw(in_XMM13,auVar60);
                  uVar37 = uVar37 + 1;
                  auVar60._2_2_ = uVar129;
                  auVar60._0_2_ = uVar128;
                  auVar60._4_2_ = uVar130;
                  auVar60._6_2_ = uVar131;
                  auVar60._8_2_ = uVar132;
                  auVar60._10_2_ = uVar133;
                  auVar60._12_2_ = uVar134;
                  auVar60._14_2_ = uVar135;
                  auVar67 = local_58;
                  uVar136 = local_48._0_8_;
                  uVar139 = uVar6;
                  uVar118 = local_68._0_8_;
                } while (local_148 != uVar37);
                auVar47 = paddsw(auVar47,_DAT_008d0b90);
                uVar29 = uVar29 + 8;
                local_b8 = uVar28;
              } while (uVar29 < local_210);
            }
            local_228 = local_1b8._0_8_;
            uStack_220 = local_1b8._8_8_;
            local_238 = local_1a8._0_8_;
            uStack_230 = local_1a8._8_8_;
            local_248 = local_198._0_8_;
            uStack_240 = local_198._8_8_;
            local_258 = local_188._0_8_;
            uStack_250 = local_188._8_8_;
            lVar25 = 0;
            iVar36 = 0;
            iVar27 = 0;
            uVar44 = uVar31;
            uVar22 = uVar31;
            uVar24 = uVar31;
            do {
              uVar1 = *(ushort *)(local_178 + lVar25 * 2);
              if ((short)(ushort)uVar31 < (short)uVar1) {
                uVar44 = (uint)*(ushort *)((long)&local_228 + lVar25 * 2);
                uVar24 = (uint)*(ushort *)((long)&local_238 + lVar25 * 2);
                uVar22 = (uint)*(ushort *)((long)&local_248 + lVar25 * 2);
                uVar31 = (uint)uVar1;
                iVar36 = (int)*(short *)((long)&local_258 + lVar25 * 2);
                iVar27 = (int)*(short *)(local_1e8 + lVar25 * 2);
              }
              else if (uVar1 == (ushort)uVar31) {
                iVar39 = (int)*(short *)(local_1e8 + lVar25 * 2);
                if (iVar39 < iVar27) {
                  uVar44 = (uint)*(ushort *)((long)&local_228 + lVar25 * 2);
                  uVar24 = (uint)*(ushort *)((long)&local_238 + lVar25 * 2);
                  uVar22 = (uint)*(ushort *)((long)&local_248 + lVar25 * 2);
                  iVar36 = (int)*(short *)((long)&local_258 + lVar25 * 2);
                  iVar27 = iVar39;
                }
                else if ((iVar27 == iVar39) &&
                        (iVar41 = (int)*(short *)((long)&local_258 + lVar25 * 2), iVar41 < iVar36))
                {
                  uVar44 = (uint)*(ushort *)((long)&local_228 + lVar25 * 2);
                  uVar24 = (uint)*(ushort *)((long)&local_238 + lVar25 * 2);
                  uVar22 = (uint)*(ushort *)((long)&local_248 + lVar25 * 2);
                  iVar36 = iVar41;
                  iVar27 = iVar39;
                }
              }
              sVar26 = (short)uVar22;
              sVar21 = (short)uVar24;
              sVar30 = (short)uVar44;
              sVar43 = (short)uVar31;
              lVar25 = lVar25 + 1;
            } while ((int)lVar25 != 8);
            auVar78._0_2_ = -(ushort)((short)local_208 < local_2a8);
            auVar78._2_2_ = -(ushort)(local_208._2_2_ < sStack_2a6);
            auVar78._4_2_ = -(ushort)(local_208._4_2_ < local_2a8);
            auVar78._6_2_ = -(ushort)(local_208._6_2_ < sStack_2a6);
            auVar78._8_2_ = -(ushort)((short)uStack_200 < local_2a8);
            auVar78._10_2_ = -(ushort)(uStack_200._2_2_ < sStack_2a6);
            auVar78._12_2_ = -(ushort)(uStack_200._4_2_ < local_2a8);
            auVar78._14_2_ = -(ushort)(uStack_200._6_2_ < sStack_2a6);
            auVar116._0_2_ = -(ushort)(local_1d8 < (short)local_1f8);
            auVar116._2_2_ = -(ushort)(sStack_1d6 < local_1f8._2_2_);
            auVar116._4_2_ = -(ushort)(sStack_1d4 < local_1f8._4_2_);
            auVar116._6_2_ = -(ushort)(sStack_1d2 < local_1f8._6_2_);
            auVar116._8_2_ = -(ushort)(sStack_1d0 < (short)uStack_1f0);
            auVar116._10_2_ = -(ushort)(sStack_1ce < uStack_1f0._2_2_);
            auVar116._12_2_ = -(ushort)(sStack_1cc < uStack_1f0._4_2_);
            auVar116._14_2_ = -(ushort)(sStack_1ca < uStack_1f0._6_2_);
            auVar116 = auVar116 | auVar78;
            if ((((((((((((((((auVar116 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar116 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar116 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar116 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar116 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar116 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar116 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar116 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar116 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar116 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar116 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar116 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar116 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar116 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar116 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar116[0xf] < '\0') {
              *(byte *)&local_160->flag = (byte)local_160->flag | 0x40;
              sVar21 = 0;
              sVar26 = 0;
              sVar30 = 0;
              sVar43 = 0;
              iVar27 = 0;
              iVar36 = 0;
            }
            local_160->score = (int)sVar43;
            local_160->end_query = iVar36;
            local_160->end_ref = iVar27;
            *(int *)(local_160->field_4).extra = (int)sVar30;
            ((local_160->field_4).stats)->similar = (int)sVar21;
            ((local_160->field_4).stats)->length = (int)sVar26;
            parasail_free(ptr_08);
            parasail_free(ptr_07);
            parasail_free(ptr_06);
            parasail_free(ptr_05);
            parasail_free(ptr_04);
            parasail_free(ptr_03);
            parasail_free(ptr_02);
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            return ppVar19;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _HM_pr = NULL;
    int16_t * restrict _HS_pr = NULL;
    int16_t * restrict _HL_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict _FM_pr = NULL;
    int16_t * restrict _FS_pr = NULL;
    int16_t * restrict _FL_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict HM_pr = NULL;
    int16_t * restrict HS_pr = NULL;
    int16_t * restrict HL_pr = NULL;
    int16_t * restrict F_pr = NULL;
    int16_t * restrict FM_pr = NULL;
    int16_t * restrict FS_pr = NULL;
    int16_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vJLimit = _mm_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int16_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i case0 = vZero;
        __m128i vNH = vNegInf0;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vNegInf0;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi16(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3],
                s1[i+4],
                s1[i+5],
                s1[i+6],
                s1[i+7]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vNM = _mm_srli_si128(vWM, 2);
            vNM = _mm_insert_epi16(vNM, HM_pr[j], 7);
            vNS = _mm_srli_si128(vWS, 2);
            vNS = _mm_insert_epi16(vNS, HS_pr[j], 7);
            vNL = _mm_srli_si128(vWL, 2);
            vNL = _mm_insert_epi16(vNL, HL_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vFM = _mm_srli_si128(vFM, 2);
            vFM = _mm_insert_epi16(vFM, FM_pr[j], 7);
            vFS = _mm_srli_si128(vFS, 2);
            vFS = _mm_insert_epi16(vFS, FS_pr[j], 7);
            vFL = _mm_srli_si128(vFL, 2);
            vFL = _mm_insert_epi16(vFL, FL_pr[j], 7);
            vF_opn = _mm_subs_epi16(vNH, vOpen);
            vF_ext = _mm_subs_epi16(vF, vGap);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vE_opn = _mm_subs_epi16(vWH, vOpen);
            vE_ext = _mm_subs_epi16(vE, vGap);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 2);
            vs2 = _mm_insert_epi16(vs2, s2[j], 7);
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            vWH = _mm_max_epi16(vWH, vZero);
            case1 = _mm_cmpeq_epi16(vWH, vNWH);
            case2 = _mm_cmpeq_epi16(vWH, vF);
            case0 = _mm_cmpeq_epi16(vWH, vZero);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi16(vs1,vs2),
                            vOne)),
                    case1);
            vWM = _mm_blendv_epi8(vWM, vZero, case0);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi16(vMat,vZero),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(vWS, vZero, case0);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vNWL, vOne), case1);
            vWL = _mm_blendv_epi8(vWL, vZero, case0);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            HM_pr[j-7] = (int16_t)_mm_extract_epi16(vWM,0);
            HS_pr[j-7] = (int16_t)_mm_extract_epi16(vWS,0);
            HL_pr[j-7] = (int16_t)_mm_extract_epi16(vWL,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            FM_pr[j-7] = (int16_t)_mm_extract_epi16(vFM,0);
            FS_pr[j-7] = (int16_t)_mm_extract_epi16(vFS,0);
            FL_pr[j-7] = (int16_t)_mm_extract_epi16(vFL,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi16(vJ, vNegOne),
                        _mm_cmplt_epi16(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi16(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi16(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi16(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *m = (int16_t*)&vMaxM;
        int16_t *s = (int16_t*)&vMaxS;
        int16_t *l = (int16_t*)&vMaxL;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++m, ++s, ++l, ++i, ++j) {
            if (*t > score) {
                score = *t;
                matches = *m;
                similar = *s;
                length = *l;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}